

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.hpp
# Opt level: O1

void __thiscall
__gnu_cxx::new_allocator<Pcode>::construct<Pcode,Pcode>
          (new_allocator<Pcode> *this,Pcode *__p,Pcode *__args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  __p->m_op = __args->m_op;
  paVar1 = &(__p->m_num1).field_2;
  (__p->m_num1)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (__args->m_num1)._M_dataplus._M_p;
  paVar2 = &(__args->m_num1).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(__args->m_num1).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__p->m_num1).field_2 + 8) = uVar4;
  }
  else {
    (__p->m_num1)._M_dataplus._M_p = pcVar3;
    (__p->m_num1).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__p->m_num1)._M_string_length = (__args->m_num1)._M_string_length;
  (__args->m_num1)._M_dataplus._M_p = (pointer)paVar2;
  (__args->m_num1)._M_string_length = 0;
  (__args->m_num1).field_2._M_local_buf[0] = '\0';
  paVar1 = &(__p->m_num2).field_2;
  (__p->m_num2)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (__args->m_num2)._M_dataplus._M_p;
  paVar2 = &(__args->m_num2).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(__args->m_num2).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__p->m_num2).field_2 + 8) = uVar4;
  }
  else {
    (__p->m_num2)._M_dataplus._M_p = pcVar3;
    (__p->m_num2).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__p->m_num2)._M_string_length = (__args->m_num2)._M_string_length;
  (__args->m_num2)._M_dataplus._M_p = (pointer)paVar2;
  (__args->m_num2)._M_string_length = 0;
  (__args->m_num2).field_2._M_local_buf[0] = '\0';
  paVar1 = &(__p->m_num3).field_2;
  (__p->m_num3)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (__args->m_num3)._M_dataplus._M_p;
  paVar2 = &(__args->m_num3).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(__args->m_num3).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__p->m_num3).field_2 + 8) = uVar4;
  }
  else {
    (__p->m_num3)._M_dataplus._M_p = pcVar3;
    (__p->m_num3).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__p->m_num3)._M_string_length = (__args->m_num3)._M_string_length;
  (__args->m_num3)._M_dataplus._M_p = (pointer)paVar2;
  (__args->m_num3)._M_string_length = 0;
  (__args->m_num3).field_2._M_local_buf[0] = '\0';
  paVar1 = &(__p->m_comment).field_2;
  (__p->m_comment)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (__args->m_comment)._M_dataplus._M_p;
  paVar2 = &(__args->m_comment).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(__args->m_comment).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__p->m_comment).field_2 + 8) = uVar4;
  }
  else {
    (__p->m_comment)._M_dataplus._M_p = pcVar3;
    (__p->m_comment).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__p->m_comment)._M_string_length = (__args->m_comment)._M_string_length;
  (__args->m_comment)._M_dataplus._M_p = (pointer)paVar2;
  (__args->m_comment)._M_string_length = 0;
  (__args->m_comment).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Pcode(PcodeType op, string num1, string num2, string num3) : m_op(op), m_num1(num1), m_num2(num2), m_num3(num3) {
        m_comment = string("");
    }